

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrSig_GetPrivkey_Test::TestBody(SchnorrSig_GetPrivkey_Test *this)

{
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  AssertionResult gtest_ar;
  string local_68;
  Privkey privkey;
  string expected_privkey;
  
  std::__cxx11::string::string
            ((string *)&expected_privkey,
             "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8",
             (allocator *)&privkey);
  cfd::core::SchnorrSignature::GetPrivkey(&privkey,&::signature);
  cfd::core::Privkey::GetData((ByteData *)&local_90,&privkey);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,(ByteData *)&local_90);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expected_privkey","privkey.GetData().GetHex()",&expected_privkey
             ,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x53,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  std::__cxx11::string::~string((string *)&expected_privkey);
  return;
}

Assistant:

TEST(SchnorrSig, GetPrivkey) {
  std::string expected_privkey =
      "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8";

  auto privkey = signature.GetPrivkey();

  EXPECT_EQ(expected_privkey, privkey.GetData().GetHex());
}